

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockArgumentHandler.hpp
# Opt level: O0

size_t __thiscall
ut11::detail::MockArgumentHandler<TestEvent<1>>::CountCalls<TestEvent<1>>
          (MockArgumentHandler<TestEvent<1>> *this,TestEvent<1> expectations)

{
  bool bVar1;
  type_conflict tVar2;
  reference arguments;
  tuple<TestEvent<1>_> *actual;
  const_iterator __end0;
  const_iterator __begin0;
  list<std::tuple<TestEvent<1>_>,_std::allocator<std::tuple<TestEvent<1>_>_>_> *__range3;
  size_t sStack_20;
  tuple<TestEvent<1>_> expectationTuple;
  size_t counter;
  MockArgumentHandler<TestEvent<1>_> *this_local;
  TestEvent<1> expectations_local;
  
  sStack_20 = 0;
  this_local._4_4_ = expectations.value;
  std::tuple<TestEvent<1>_>::tuple<TestEvent<1>_&,_true,_true>
            ((tuple<TestEvent<1>_> *)((long)&__range3 + 4),(TestEvent<1> *)((long)&this_local + 4));
  __end0 = std::__cxx11::
           list<std::tuple<TestEvent<1>_>,_std::allocator<std::tuple<TestEvent<1>_>_>_>::begin
                     ((list<std::tuple<TestEvent<1>_>,_std::allocator<std::tuple<TestEvent<1>_>_>_>
                       *)this);
  actual = (tuple<TestEvent<1>_> *)
           std::__cxx11::
           list<std::tuple<TestEvent<1>_>,_std::allocator<std::tuple<TestEvent<1>_>_>_>::end
                     ((list<std::tuple<TestEvent<1>_>,_std::allocator<std::tuple<TestEvent<1>_>_>_>
                       *)this);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&actual), bVar1) {
    arguments = std::_List_const_iterator<std::tuple<TestEvent<1>_>_>::operator*(&__end0);
    tVar2 = std::enable_if<(0)<(1),bool>::type_ut11::detail::MockArgumentHandler<TestEvent<1>>::
            MatchTuples<0,1,std::tuple<TestEvent<1>>,std::tuple<TestEvent<1>>>
                      ((tuple<TestEvent<1>>_std *)this,arguments,
                       (tuple<TestEvent<1>_> *)((long)&__range3 + 4));
    if (tVar2) {
      sStack_20 = sStack_20 + 1;
    }
    std::_List_const_iterator<std::tuple<TestEvent<1>_>_>::operator++(&__end0);
  }
  return sStack_20;
}

Assistant:

std::size_t CountCalls(Expectations... expectations) const
			{
				static_assert(sizeof...(Expectations) == sizeof...(ARGS), "Expectations and Arguments must match");

				std::size_t counter = 0;

				std::tuple<Expectations...> expectationTuple(expectations...);
				for(const std::tuple<ARGS...>& actual : m_arguments)
				{
					if ( MatchTuples<0, sizeof...(ARGS)>(actual, expectationTuple) )
						++counter;
				}
				return counter;
			}